

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth.c
# Opt level: O2

_Bool csp_eth_pack_header(csp_eth_header_t *buf,uint16_t packet_id,uint16_t src_addr,
                         uint16_t seg_size,uint16_t packet_length)

{
  if (buf != (csp_eth_header_t *)0x0) {
    buf->packet_id = packet_id << 8 | packet_id >> 8;
    buf->src_addr = src_addr << 8 | src_addr >> 8;
    buf->seg_size = seg_size << 8 | seg_size >> 8;
    buf->packet_length = packet_length << 8 | packet_length >> 8;
  }
  return buf != (csp_eth_header_t *)0x0;
}

Assistant:

bool csp_eth_pack_header(csp_eth_header_t * buf, 
                            uint16_t packet_id, uint16_t src_addr,
                            uint16_t seg_size, uint16_t packet_length) {

    if (buf == NULL) return false;

    buf->packet_id = htobe16(packet_id);
    buf->src_addr = htobe16(src_addr);
    buf->seg_size = htobe16(seg_size);
    buf->packet_length = htobe16(packet_length);

    return true;
}